

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O1

void __thiscall
mjs::native_error_exception::native_error_exception
          (native_error_exception *this,native_error_type type,wstring_view *stack_trace,
          string_view *msg)

{
  wchar_t *local_58;
  size_t local_50;
  long local_48 [2];
  wstring_view local_38;
  
  local_58 = (wchar_t *)local_48;
  std::__cxx11::wstring::_M_construct<char_const*>
            ((wstring *)&local_58,msg->_M_str,msg->_M_str + msg->_M_len);
  local_38._M_len = local_50;
  local_38._M_str = local_58;
  native_error_exception(this,type,stack_trace,&local_38);
  if (local_58 != (wchar_t *)local_48) {
    operator_delete(local_58,local_48[0] * 4 + 4);
  }
  return;
}

Assistant:

native_error_exception::native_error_exception(native_error_type type, const std::wstring_view& stack_trace, const std::string_view& msg)
    : native_error_exception{type, stack_trace, std::wstring{msg.begin(), msg.end()}} {
}